

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

int __thiscall
sqvector<SQObjectPtr>::copy(sqvector<SQObjectPtr> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long *plVar1;
  uint uVar2;
  SQObjectPtr *pSVar3;
  long lVar4;
  SQObjectPtr *in_RAX;
  SQObjectPtr *extraout_RAX;
  ulong uVar5;
  ulong uVar6;
  SQObjectPtr local_28;
  
  if (this->_size != 0) {
    local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_28.super_SQObject._type = OT_NULL;
    resize(this,0,&local_28);
    SQObjectPtr::~SQObjectPtr(&local_28);
    in_RAX = extraout_RAX;
  }
  uVar6 = *(ulong *)(dst + 8);
  if (this->_allocated < uVar6) {
    in_RAX = (SQObjectPtr *)sq_vm_realloc(this->_vals,this->_allocated << 4,uVar6 << 4);
    this->_vals = in_RAX;
    this->_allocated = uVar6;
  }
  uVar6 = *(ulong *)(dst + 8);
  if (uVar6 != 0) {
    in_RAX = (SQObjectPtr *)&DAT_00000008;
    uVar5 = 0;
    do {
      pSVar3 = this->_vals;
      lVar4 = *(long *)dst;
      uVar2 = *(uint *)(lVar4 + -8 + (long)in_RAX);
      *(uint *)((long)&pSVar3[-1].super_SQObject._unVal + (long)in_RAX) = uVar2;
      *(undefined8 *)((long)&(pSVar3->super_SQObject)._type + (long)&(in_RAX->super_SQObject)._type)
           = *(undefined8 *)((long)&(in_RAX->super_SQObject)._type + lVar4);
      if ((uVar2 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(*(long *)((long)&(pSVar3->super_SQObject)._type +
                                   (long)&(in_RAX->super_SQObject)._type) + 8);
        *plVar1 = *plVar1 + 1;
      }
      uVar5 = uVar5 + 1;
      uVar6 = *(ulong *)(dst + 8);
      in_RAX = in_RAX + 1;
    } while (uVar5 < uVar6);
  }
  this->_size = uVar6;
  return (int)in_RAX;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }